

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O0

PrimitiveType sglr::rr_util::mapGLPrimitiveType(deUint32 type)

{
  PrimitiveType local_c;
  deUint32 type_local;
  
  switch(type) {
  case 0:
    local_c = PRIMITIVETYPE_POINTS;
    break;
  case 1:
    local_c = PRIMITIVETYPE_LINES;
    break;
  case 2:
    local_c = PRIMITIVETYPE_LINE_LOOP;
    break;
  case 3:
    local_c = PRIMITIVETYPE_LINE_STRIP;
    break;
  case 4:
    local_c = PRIMITIVETYPE_TRIANGLES;
    break;
  case 5:
    local_c = PRIMITIVETYPE_TRIANGLE_STRIP;
    break;
  case 6:
    local_c = PRIMITIVETYPE_TRIANGLE_FAN;
    break;
  default:
    local_c = PRIMITIVETYPE_LAST;
    break;
  case 10:
    local_c = PRIMITIVETYPE_LINES_ADJACENCY;
    break;
  case 0xb:
    local_c = PRIMITIVETYPE_LINE_STRIP_ADJACENCY;
    break;
  case 0xc:
    local_c = PRIMITIVETYPE_TRIANGLES_ADJACENCY;
    break;
  case 0xd:
    local_c = PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY;
  }
  return local_c;
}

Assistant:

rr::PrimitiveType mapGLPrimitiveType (deUint32 type)
{
	switch (type)
	{
		case GL_TRIANGLES:					return rr::PRIMITIVETYPE_TRIANGLES;
		case GL_TRIANGLE_STRIP:				return rr::PRIMITIVETYPE_TRIANGLE_STRIP;
		case GL_TRIANGLE_FAN:				return rr::PRIMITIVETYPE_TRIANGLE_FAN;
		case GL_LINES:						return rr::PRIMITIVETYPE_LINES;
		case GL_LINE_STRIP:					return rr::PRIMITIVETYPE_LINE_STRIP;
		case GL_LINE_LOOP:					return rr::PRIMITIVETYPE_LINE_LOOP;
		case GL_POINTS:						return rr::PRIMITIVETYPE_POINTS;
		case GL_LINES_ADJACENCY:			return rr::PRIMITIVETYPE_LINES_ADJACENCY;
		case GL_LINE_STRIP_ADJACENCY:		return rr::PRIMITIVETYPE_LINE_STRIP_ADJACENCY;
		case GL_TRIANGLES_ADJACENCY:		return rr::PRIMITIVETYPE_TRIANGLES_ADJACENCY;
		case GL_TRIANGLE_STRIP_ADJACENCY:	return rr::PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY;
		default:
			DE_ASSERT(false);
			return rr::PRIMITIVETYPE_LAST;
	}
}